

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab8-0.c
# Opt level: O1

int Check(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *pFVar5;
  char *pcVar6;
  size_t __n;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  FILE *out;
  bool bVar13;
  TTestcaseData TVar14;
  TTestcaseData TVar15;
  uint b;
  uint a;
  char bufMsg [128];
  uint local_4e88;
  uint local_4e80;
  uint local_4e7c;
  char *local_4e78;
  FILE *local_4e70;
  ulong local_4e68;
  unsigned_long_long local_4e60;
  uint local_4e58 [5002];
  
  pFVar5 = fopen("out.txt","r");
  if (pFVar5 == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar3 = 0xffffffff;
    goto LAB_00101891;
  }
  TVar14 = GetFromTestcase(TestcaseIdx,ERROR_MESSAGE,0xffffffff);
  pcVar7 = TVar14.String;
  if (pcVar7 == (char *)0x0) {
    iVar2 = 0;
    TVar14 = GetFromTestcase(TestcaseIdx,VERTEX_COUNT,0xffffffff);
    local_4e60 = TVar14.Integer;
    uVar3 = TVar14.Edge.Begin;
    if (uVar3 != 0) {
      uVar10 = 0;
      do {
        local_4e58[uVar10] = (uint)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar3 != uVar10);
    }
    pcVar6 = "PASSED";
    uVar10 = 0;
    out = pFVar5;
    local_4e70 = pFVar5;
    do {
      pFVar5 = out;
      if (iVar2 == (uVar3 - 1) + (uint)(uVar3 == 0)) break;
      pcVar7 = ScanUintUint((FILE *)out,&local_4e7c,&local_4e80);
      uVar9 = local_4e7c;
      uVar1 = local_4e80;
      if (pcVar7 == "PASSED") {
        local_4e88 = 0xffffffff;
        TVar14 = GetFromTestcase(TestcaseIdx,VERTEX_COUNT,0xffffffff);
        if ((uVar9 != 0) && (uVar1 - 1 < TVar14.Edge.Begin && uVar9 <= TVar14.Edge.Begin)) {
          local_4e88 = 0xffffffff;
          local_4e78 = pcVar6;
          TVar14 = GetFromTestcase(TestcaseIdx,EDGE_COUNT,0xffffffff);
          pcVar6 = local_4e78;
          if (TVar14.Edge.Begin != 0) {
            uVar12 = 0;
            local_4e68 = uVar10;
            do {
              TVar15 = GetFromTestcase(TestcaseIdx,EDGE,uVar12);
              uVar4 = TVar15.Edge.Begin;
              uVar8 = TVar15.Edge.End;
              if (uVar1 == uVar8 && uVar9 == uVar4) {
                bVar13 = false;
                out = (FILE *)(ulong)uVar12;
              }
              else {
                bVar13 = uVar8 != uVar9 || uVar1 != uVar4;
                out = (FILE *)((ulong)out & 0xffffffff);
                if (uVar8 == uVar9 && uVar1 == uVar4) {
                  out = (FILE *)(ulong)uVar12;
                }
              }
              uVar10 = local_4e68;
              pcVar6 = local_4e78;
              pFVar5 = local_4e70;
              if (!bVar13) {
                local_4e88 = (uint)out;
                break;
              }
              uVar12 = uVar12 + 1;
            } while (TVar14.Edge.Begin != uVar12);
          }
        }
        if (local_4e88 == 0xffffffff) {
          bVar13 = false;
          printf("wrong output -- ");
          pcVar6 = "FAILED";
        }
        else {
          uVar1 = local_4e7c - 1;
          do {
            uVar9 = uVar1;
            uVar1 = local_4e58[uVar9];
          } while (uVar9 != local_4e58[uVar9]);
          uVar1 = local_4e80 - 1;
          do {
            uVar12 = uVar1;
            uVar1 = local_4e58[uVar12];
          } while (uVar12 != local_4e58[uVar12]);
          if (uVar9 == uVar12) {
            printf("wrong output -- ");
            out = pFVar5;
            goto LAB_00101675;
          }
          local_4e58[uVar9] = uVar12;
          TVar14 = GetFromTestcase(TestcaseIdx,EDGE,local_4e88);
          uVar10 = uVar10 + TVar14.Edge.Length;
          bVar13 = true;
        }
      }
      else {
LAB_00101675:
        bVar13 = false;
        pcVar6 = "FAILED";
        pFVar5 = out;
      }
      iVar2 = iVar2 + 1;
      out = pFVar5;
    } while (bVar13);
    if (pcVar6 == "PASSED") {
      if ((int)local_4e60 != 0) {
        uVar11 = 0;
        iVar2 = 0;
        do {
          iVar2 = iVar2 + (uint)(uVar11 == local_4e58[uVar11]);
          uVar11 = uVar11 + 1;
        } while ((local_4e60 & 0xffffffff) != uVar11);
        if ((iVar2 == 1) &&
           (TVar14 = GetFromTestcase(TestcaseIdx,MST_LENGTH,0xffffffff), uVar10 <= TVar14.Integer))
        {
          pcVar6 = "PASSED";
          goto LAB_0010184a;
        }
      }
      printf("wrong output -- ");
      pcVar6 = "FAILED";
    }
  }
  else {
    local_4e58[0x1c] = 0;
    local_4e58[0x1d] = 0;
    local_4e58[0x1e] = 0;
    local_4e58[0x1f] = 0;
    local_4e58[0x18] = 0;
    local_4e58[0x19] = 0;
    local_4e58[0x1a] = 0;
    local_4e58[0x1b] = 0;
    local_4e58[0x14] = 0;
    local_4e58[0x15] = 0;
    local_4e58[0x16] = 0;
    local_4e58[0x17] = 0;
    local_4e58[0x10] = 0;
    local_4e58[0x11] = 0;
    local_4e58[0x12] = 0;
    local_4e58[0x13] = 0;
    local_4e58[0xc] = 0;
    local_4e58[0xd] = 0;
    local_4e58[0xe] = 0;
    local_4e58[0xf] = 0;
    local_4e58[8] = 0;
    local_4e58[9] = 0;
    local_4e58[10] = 0;
    local_4e58[0xb] = 0;
    local_4e58[4] = 0;
    local_4e58[5] = 0;
    local_4e58[6] = 0;
    local_4e58[7] = 0;
    local_4e58[0] = 0;
    local_4e58[1] = 0;
    local_4e58[2] = 0;
    local_4e58[3] = 0;
    pcVar6 = ScanChars((FILE *)pFVar5,0x80,(char *)local_4e58);
    if (pcVar6 == "PASSED") {
      __n = strlen(pcVar7);
      iVar2 = strncasecmp(pcVar7,(char *)local_4e58,__n);
      if (iVar2 == 0) {
        pcVar6 = "PASSED";
      }
      else {
        printf("wrong output -- ");
        pcVar6 = "FAILED";
      }
    }
  }
LAB_0010184a:
  if (pcVar6 == "PASSED") {
    iVar2 = HaveGarbageAtTheEnd((FILE *)pFVar5);
    if (iVar2 == 0) {
      pcVar6 = "PASSED";
    }
    else {
      pcVar6 = "FAILED";
    }
  }
  fclose(pFVar5);
  puts(pcVar6);
  uVar3 = (uint)(pcVar6 == "FAILED");
LAB_00101891:
  TestcaseIdx = TestcaseIdx + 1;
  return uVar3;
}

Assistant:

static int Check(void) {
    FILE* const out = fopen("out.txt", "r");
    if (out == NULL) {
        printf("can't open out.txt\n");
        ++TestcaseIdx;
        return -1;
    }
    const char* status = Pass;
    const char* message = GetFromTestcase(TestcaseIdx, ERROR_MESSAGE, IGNORED_EDGE_IDX).String;
    if (message != NULL) { // test error message
        char bufMsg[128] = {0};
        status = ScanChars(out, sizeof(bufMsg), bufMsg);
        if (status == Pass && _strnicmp(message, bufMsg, strlen(message)) != 0) {
            printf("wrong output -- ");
            status = Fail;
        }
    } else { // test spanning tree
        const unsigned vertexCount = GetVertexCount();
        unsigned vertexParent[MAX_VERTEX_COUNT];
        unsigned long long length = 0;
        InitParent(vertexCount, vertexParent);
        for (unsigned idx = 0; idx + 1 < vertexCount; ++idx) {
            unsigned a, b;
            if (ScanUintUint(out, &a, &b) != Pass) {
                status = Fail;
                break;
            }
            const unsigned edgeIdx = FindEdge(a, b);
            if (edgeIdx == IGNORED_EDGE_IDX) {
                printf("wrong output -- ");
                status = Fail;
                break;
            }
            const unsigned rootA = FindRoot(a - 1, vertexParent);
            const unsigned rootB = FindRoot(b - 1, vertexParent);
            if (rootA == rootB) {
                printf("wrong output -- ");
                status = Fail;
                break;
            }
            vertexParent[rootA] = rootB;
            length += GetFromTestcase(TestcaseIdx, EDGE, edgeIdx).Edge.Length;
        }
        if (status == Pass) {
            if (CountRoots(vertexCount, vertexParent) != 1 || length > GetFromTestcase(TestcaseIdx, MST_LENGTH, IGNORED_EDGE_IDX).Integer) {
                printf("wrong output -- ");
                status = Fail;
            }
        }
    }
    if (status == Pass && HaveGarbageAtTheEnd(out)) {
        status = Fail;
    }
    fclose(out);
    printf("%s\n", status);
    ++TestcaseIdx;
    return status == Fail;
}